

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  undefined1 *puVar1;
  proxy_info *ppVar2;
  char *pcVar3;
  CURLUcode CVar4;
  int iVar5;
  CURLcode CVar6;
  CURLU *u;
  ulong uVar7;
  size_t sVar8;
  curl_proxytype cVar9;
  char *scheme;
  char *proxypasswd;
  char *proxyuser;
  proxy_info *local_50;
  char *host;
  char *portptr;
  proxy_info *local_38;
  
  portptr = (char *)0x0;
  proxyuser = (char *)0x0;
  proxypasswd = (char *)0x0;
  u = curl_url();
  scheme = (char *)0x0;
  CVar4 = curl_url_set(u,CURLUPART_URL,proxy,0x208);
  if (CVar4 != CURLUE_OK) {
    Curl_failf(data,"Unsupported proxy syntax in \'%s\'",proxy);
    CVar6 = CURLE_COULDNT_RESOLVE_PROXY;
    goto LAB_001486c2;
  }
  CVar4 = curl_url_get(u,CURLUPART_SCHEME,&scheme,0);
  if (CVar4 != CURLUE_OK) {
    CVar6 = CURLE_OUT_OF_MEMORY;
    goto LAB_001486c2;
  }
  iVar5 = Curl_strcasecompare("https",scheme);
  if (iVar5 == 0) {
    iVar5 = Curl_strcasecompare("socks5h",scheme);
    if (iVar5 == 0) {
      iVar5 = Curl_strcasecompare("socks5",scheme);
      if (iVar5 == 0) {
        iVar5 = Curl_strcasecompare("socks4a",scheme);
        if (iVar5 == 0) {
          iVar5 = Curl_strcasecompare("socks4",scheme);
          cVar9 = CURLPROXY_SOCKS4;
          if (((iVar5 == 0) && (iVar5 = Curl_strcasecompare("socks",scheme), iVar5 == 0)) &&
             (iVar5 = Curl_strcasecompare("http",scheme), cVar9 = proxytype, iVar5 == 0)) {
            Curl_failf(data,"Unsupported proxy scheme for \'%s\'",proxy);
            CVar6 = CURLE_COULDNT_CONNECT;
            goto LAB_001486c2;
          }
        }
        else {
          cVar9 = CURLPROXY_SOCKS4A;
        }
      }
      else {
        cVar9 = CURLPROXY_SOCKS5;
      }
    }
    else {
      cVar9 = CURLPROXY_SOCKS5_HOSTNAME;
    }
  }
  else {
    cVar9 = CURLPROXY_HTTPS;
  }
  if ((cVar9 == CURLPROXY_HTTPS) && ((Curl_ssl->supports & 0x10) == 0)) {
    Curl_failf(data,"Unsupported proxy \'%s\', libcurl is built without the HTTPS-proxy support.",
               proxy);
    CVar6 = CURLE_NOT_BUILT_IN;
    goto LAB_001486c2;
  }
  local_38 = &conn->socks_proxy;
  local_50 = &conn->http_proxy;
  if ((cVar9 & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4) {
    local_50 = local_38;
  }
  local_50->proxytype = cVar9;
  CVar4 = curl_url_get(u,CURLUPART_USER,&proxyuser,0x40);
  if (((CVar4 != CURLUE_NO_USER) && (CVar6 = CURLE_OK, CVar4 != CURLUE_OK)) ||
     ((CVar4 = curl_url_get(u,CURLUPART_PASSWORD,&proxypasswd,0x40), ppVar2 = local_50,
      CVar4 != CURLUE_NO_PASSWORD && (CVar6 = CURLE_OK, CVar4 != CURLUE_OK)))) goto LAB_001486c2;
  if (proxypasswd != (char *)0x0 || proxyuser != (char *)0x0) {
    (*Curl_cfree)(local_50->user);
    ppVar2->user = proxyuser;
    CVar6 = Curl_setstropt(&(data->state).aptr.proxyuser,proxyuser);
    ppVar2 = local_50;
    proxyuser = (char *)0x0;
    if (CVar6 != CURLE_OK) goto LAB_001486c2;
    (*Curl_cfree)(local_50->passwd);
    ppVar2->passwd = (char *)0x0;
    if ((proxypasswd == (char *)0x0) &&
       (proxypasswd = (*Curl_cstrdup)(""), proxypasswd == (char *)0x0)) {
      CVar6 = CURLE_OUT_OF_MEMORY;
      proxypasswd = (char *)0x0;
      goto LAB_001486c2;
    }
    ppVar2->passwd = proxypasswd;
    CVar6 = Curl_setstropt(&(data->state).aptr.proxypasswd,proxypasswd);
    proxypasswd = (char *)0x0;
    if (CVar6 != CURLE_OK) goto LAB_001486c2;
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 | 4;
  }
  curl_url_get(u,CURLUPART_PORT,&portptr,0);
  if (portptr == (char *)0x0) {
    uVar7 = (data->set).proxyport;
    if (uVar7 != 0) goto LAB_00148615;
    uVar7 = 0x438;
    if (cVar9 == CURLPROXY_HTTPS) {
      uVar7 = 0x1bb;
    }
LAB_0014862c:
    local_50->port = uVar7 & 0xffffffff;
    if ((((cVar9 & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4) || (conn->port < 0))
       || ((local_38->host).rawalloc == (char *)0x0)) {
      conn->port = (int)uVar7;
    }
  }
  else {
    uVar7 = strtol(portptr,(char **)0x0,10);
    (*Curl_cfree)(portptr);
LAB_00148615:
    if (-1 < (int)uVar7) goto LAB_0014862c;
  }
  CVar4 = curl_url_get(u,CURLUPART_HOST,&host,0x40);
  ppVar2 = local_50;
  CVar6 = CURLE_OUT_OF_MEMORY;
  if (CVar4 == CURLUE_OK) {
    (*Curl_cfree)((local_50->host).rawalloc);
    pcVar3 = host;
    (ppVar2->host).rawalloc = host;
    if (*host == '[') {
      sVar8 = strlen(host);
      pcVar3[sVar8 - 1] = '\0';
      host = host + 1;
      zonefrom_url(u,data,conn);
    }
    (ppVar2->host).name = host;
    CVar6 = CURLE_OK;
  }
LAB_001486c2:
  (*Curl_cfree)(proxyuser);
  (*Curl_cfree)(proxypasswd);
  (*Curl_cfree)(scheme);
  curl_url_cleanup(u);
  return CVar6;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *portptr = NULL;
  int port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  char *host;
  bool sockstype;
  CURLUcode uc;
  struct proxy_info *proxyinfo;
  CURLU *uhp = curl_url();
  CURLcode result = CURLE_OK;
  char *scheme = NULL;

  /* When parsing the proxy, allowing non-supported schemes since we have
     these made up ones for proxies. Guess scheme for URLs without it. */
  uc = curl_url_set(uhp, CURLUPART_URL, proxy,
                    CURLU_NON_SUPPORT_SCHEME|CURLU_GUESS_SCHEME);
  if(!uc) {
    /* parsed okay as a URL */
    uc = curl_url_get(uhp, CURLUPART_SCHEME, &scheme, 0);
    if(uc) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    if(strcasecompare("https", scheme))
      proxytype = CURLPROXY_HTTPS;
    else if(strcasecompare("socks5h", scheme))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(strcasecompare("socks5", scheme))
      proxytype = CURLPROXY_SOCKS5;
    else if(strcasecompare("socks4a", scheme))
      proxytype = CURLPROXY_SOCKS4A;
    else if(strcasecompare("socks4", scheme) ||
            strcasecompare("socks", scheme))
      proxytype = CURLPROXY_SOCKS4;
    else if(strcasecompare("http", scheme))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      result = CURLE_COULDNT_CONNECT;
      goto error;
    }
  }
  else {
    failf(data, "Unsupported proxy syntax in \'%s\'", proxy);
    result = CURLE_COULDNT_RESOLVE_PROXY;
    goto error;
  }

#ifdef USE_SSL
  if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
#endif
    if(proxytype == CURLPROXY_HTTPS) {
      failf(data, "Unsupported proxy \'%s\', libcurl is built without the "
                  "HTTPS-proxy support.", proxy);
      result = CURLE_NOT_BUILT_IN;
      goto error;
    }

  sockstype =
    proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
    proxytype == CURLPROXY_SOCKS5 ||
    proxytype == CURLPROXY_SOCKS4A ||
    proxytype == CURLPROXY_SOCKS4;

  proxyinfo = sockstype ? &conn->socks_proxy : &conn->http_proxy;
  proxyinfo->proxytype = proxytype;

  /* Is there a username and password given in this proxy url? */
  uc = curl_url_get(uhp, CURLUPART_USER, &proxyuser, CURLU_URLDECODE);
  if(uc && (uc != CURLUE_NO_USER))
    goto error;
  uc = curl_url_get(uhp, CURLUPART_PASSWORD, &proxypasswd, CURLU_URLDECODE);
  if(uc && (uc != CURLUE_NO_PASSWORD))
    goto error;

  if(proxyuser || proxypasswd) {
    Curl_safefree(proxyinfo->user);
    proxyinfo->user = proxyuser;
    result = Curl_setstropt(&data->state.aptr.proxyuser, proxyuser);
    proxyuser = NULL;
    if(result)
      goto error;
    Curl_safefree(proxyinfo->passwd);
    if(!proxypasswd) {
      proxypasswd = strdup("");
      if(!proxypasswd) {
        result = CURLE_OUT_OF_MEMORY;
        goto error;
      }
    }
    proxyinfo->passwd = proxypasswd;
    result = Curl_setstropt(&data->state.aptr.proxypasswd, proxypasswd);
    proxypasswd = NULL;
    if(result)
      goto error;
    conn->bits.proxy_user_passwd = TRUE; /* enable it */
  }

  (void)curl_url_get(uhp, CURLUPART_PORT, &portptr, 0);

  if(portptr) {
    port = (int)strtol(portptr, NULL, 10);
    free(portptr);
  }
  else {
    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = (int)data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }
  if(port >= 0) {
    proxyinfo->port = port;
    if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
      conn->port = port;
  }

  /* now, clone the proxy host name */
  uc = curl_url_get(uhp, CURLUPART_HOST, &host, CURLU_URLDECODE);
  if(uc) {
    result = CURLE_OUT_OF_MEMORY;
    goto error;
  }
  Curl_safefree(proxyinfo->host.rawalloc);
  proxyinfo->host.rawalloc = host;
  if(host[0] == '[') {
    /* this is a numerical IPv6, strip off the brackets */
    size_t len = strlen(host);
    host[len-1] = 0; /* clear the trailing bracket */
    host++;
    zonefrom_url(uhp, data, conn);
  }
  proxyinfo->host.name = host;

  error:
  free(proxyuser);
  free(proxypasswd);
  free(scheme);
  curl_url_cleanup(uhp);
  return result;
}